

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseParenthesisExpression(Parser *this)

{
  TokenType TVar1;
  undefined8 extraout_RAX;
  Parser *in_RSI;
  Parser *this_00;
  allocator local_31;
  
  nextToken(in_RSI);
  parseExpression(this);
  TVar1 = Token::type(&in_RSI->mCurrentToken);
  if (TVar1 == RIGHT_PARENTHESIS) {
    nextToken(in_RSI);
    return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
           (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
  }
  this_00 = (Parser *)&stack0xffffffffffffffd0;
  std::__cxx11::string::string((string *)this_00,"Expected \').\'",&local_31);
  parseError(this_00,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::unique_ptr<Expression,_std::default_delete<Expression>_>::~unique_ptr
            ((unique_ptr<Expression,_std::default_delete<Expression>_> *)this);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::unique_ptr<Expression> Parser::parseParenthesisExpression() {
	nextToken(); //Eat the '('
	auto expr = parseExpression();

	if (mCurrentToken.type() != TokenType::RIGHT_PARENTHESIS) {
		parseError("Expected ').'");
	}

	nextToken(); //Eat the ')'
	return expr;
}